

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_flow_switch_stmt(gvisitor_t *self,gnode_flow_stmt_t *node)

{
  long *plVar1;
  ircode_t *code_00;
  gnode_t *pgVar2;
  uint32_t nlabel;
  uint32_t p2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t local_ec;
  uint32_t local_dc;
  uint32_t local_cc;
  uint32_t local_bc;
  uint32_t local_a4;
  int *local_88;
  gnode_t *local_80;
  gnode_label_stmt_t *case_stmt;
  gtoken_t type;
  gnode_t *val;
  size_t _i;
  size_t _len;
  gnode_label_stmt_t *default_stmt;
  gnode_compound_stmt_t *cases;
  uint32_t label_final;
  uint32_t reg;
  uint32_t cond_reg;
  ircode_t *code;
  gravity_function_t *context_function;
  gravity_object_t *context_object;
  gnode_flow_stmt_t *node_local;
  gvisitor_t *self_local;
  
  plVar1 = *(long **)(*(long *)((long)self->data + 0x10) + (*self->data + -1) * 8);
  if ((plVar1 == (long *)0x0) || ((gravity_class_t *)*plVar1 != gravity_class_function)) {
    report_error(self,&node->base,"Invalid code context.");
  }
  else {
    code_00 = (ircode_t *)plVar1[0x14];
    nlabel = ircode_newlabel(code_00);
    ircode_setlabel_false(code_00,nlabel);
    gvisit(self,node->cond);
    p2 = ircode_register_last(code_00);
    if (p2 == 0xffffffff) {
      report_error(self,&node->base,"Invalid switch condition expression.");
    }
    if ((node->stmt == (gnode_t *)0x0) || (node->stmt->tag != NODE_COMPOUND_STAT)) {
      report_error(self,&node->base,"Invalid switch stmt expression.");
    }
    pgVar2 = node->stmt;
    _len = 0;
    if (*(long *)&pgVar2[1].block_length == 0) {
      local_80 = (gnode_t *)0x0;
    }
    else {
      local_80 = (gnode_t *)**(ulong **)&pgVar2[1].block_length;
    }
    for (val = (gnode_t *)0x0; val < local_80; val = (gnode_t *)((long)&val->tag + 1)) {
      if (val < (gnode_t *)**(ulong **)&pgVar2[1].block_length) {
        local_88 = *(int **)(*(long *)(*(long *)&pgVar2[1].block_length + 0x10) + (long)val * 8);
      }
      else {
        local_88 = (int *)0x0;
      }
      if ((local_88 != (int *)0x0) && (*local_88 == 2)) {
        if (local_88[4] == 0x25) {
          gvisit(self,*(gnode_t **)(local_88 + 0x12));
          uVar3 = ircode_register_pop(code_00);
          if (uVar3 == 0xffffffff) {
            report_error(self,&node->base,"Invalid switch case expression.");
          }
          uVar4 = ircode_newlabel(code_00);
          local_88[0x16] = uVar4;
          if (node == (gnode_flow_stmt_t *)0x0) {
            local_a4 = 0;
          }
          else {
            local_a4 = local_88[5];
          }
          ircode_add(code_00,NEQ,uVar3,p2,uVar3,local_a4);
          if (node == (gnode_flow_stmt_t *)0x0) {
            local_bc = 0;
          }
          else {
            local_bc = local_88[5];
          }
          ircode_add(code_00,JUMPF,uVar3,local_88[0x16],0,local_bc);
        }
        else if (local_88[4] == 10) {
          _len = (size_t)local_88;
          uVar3 = ircode_newlabel(code_00);
          local_88[0x16] = uVar3;
        }
      }
    }
    if (_len == 0) {
      if (node == (gnode_flow_stmt_t *)0x0) {
        local_dc = 0;
      }
      else {
        local_dc = (node->base).token.lineno;
      }
      ircode_add(code_00,JUMP,nlabel,0,0,local_dc);
    }
    else {
      if (node == (gnode_flow_stmt_t *)0x0) {
        local_cc = 0;
      }
      else {
        local_cc = *(uint32_t *)(_len + 0x14);
      }
      ircode_add(code_00,JUMP,*(uint32_t *)(_len + 0x58),0,0,local_cc);
    }
    ircode_register_pop(code_00);
    gvisit(self,node->stmt);
    if (node == (gnode_flow_stmt_t *)0x0) {
      local_ec = 0;
    }
    else {
      local_ec = (node->base).token.lineno;
    }
    ircode_marklabel(code_00,nlabel,local_ec);
    ircode_unsetlabel_false(code_00);
  }
  return;
}

Assistant:

static void visit_flow_switch_stmt (gvisitor_t *self, gnode_flow_stmt_t *node) {
    DEBUG_CODEGEN("visit_flow_switch_stmt");
    DECLARE_CODE();

    /*
         <condition>
         <case jumps>
         if-equal case_expr1: goto $case1
         if-equal case_expr2: goto $case2
         ...
         if-equal case_exprN: goto $caseN
         if-exist default:    goto $default
         goto $end
         <cases>
         $case1:
         $case2:
         ...
         $caseN:
         [$default:]
         $end:
     */

    uint32_t cond_reg, reg;
    uint32_t label_final = ircode_newlabel(code);

    ircode_setlabel_false(code, label_final);

    visit(node->cond);
    cond_reg = ircode_register_last(code);
    if (cond_reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid switch condition expression.");
    if (!NODE_ISA(node->stmt, NODE_COMPOUND_STAT)) {
        report_error(self, (gnode_t *)node, "Invalid switch stmt expression.");
    }
    gnode_compound_stmt_t *cases = (gnode_compound_stmt_t *)node->stmt;
    gnode_label_stmt_t *default_stmt = NULL;
    gnode_array_each(cases->stmts, {
        if (NODE_ISA(val, NODE_LABEL_STAT)) {
            gtoken_t type = val->token.type;
            if (TOK_KEY_CASE == type) {
                gnode_label_stmt_t *case_stmt = (gnode_label_stmt_t *)val;
                visit(case_stmt->expr);
                reg = ircode_register_pop(code);
                if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid switch case expression.");

                case_stmt->label_case = ircode_newlabel(code);
                ircode_add(code, NEQ, reg, cond_reg, reg, LINE_NUMBER(case_stmt));
                ircode_add(code, JUMPF, reg, case_stmt->label_case, 0, LINE_NUMBER(case_stmt));
            } else if (TOK_KEY_DEFAULT == type) {
                default_stmt = (gnode_label_stmt_t *)val;
                default_stmt->label_case = ircode_newlabel(code);
            }
        }
    });
    if (NULL != default_stmt) {
        ircode_add(code, JUMP, default_stmt->label_case, 0, 0, LINE_NUMBER(default_stmt));
    } else {
        ircode_add(code, JUMP, label_final, 0, 0, LINE_NUMBER(node));
    }
    // pop cond_reg
    ircode_register_pop(code);

    visit(node->stmt);
    ircode_marklabel(code, label_final, LINE_NUMBER(node));
    ircode_unsetlabel_false(code);

    return;
}